

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Little_Hexy.cpp
# Opt level: O2

void __thiscall
chrono::copter::Little_Hexy::AddCollisionShapes
          (Little_Hexy *this,shared_ptr<chrono::ChMaterialSurface> *material)

{
  element_type *peVar1;
  __shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2> local_c8;
  __shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2> local_b8;
  undefined8 local_a8;
  __shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2> local_98;
  __shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2> local_88;
  ChMatrix33<double> matr;
  
  std::__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2> *)&matr,
             (__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2> *)
             ((this->super_Copter<6>).chassis.
              super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 0x198));
  (**(code **)(*(long *)matr.super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data.array[0] + 0x18))();
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             (matr.super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array +
             1));
  std::__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_c8,
             (__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2> *)
             ((this->super_Copter<6>).chassis.
              super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 0x198));
  peVar1 = local_c8._M_ptr;
  std::__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_98,
             &material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>);
  local_a8 = 0;
  local_b8._M_ptr = (element_type *)0x0;
  local_b8._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ChMatrix33<double>::ChMatrix33(&matr,1.0);
  (**(code **)(*(long *)peVar1 + 0x38))
            (0x3fd1db22d0e56042,0x3fd1db22d0e56042,0x3fdd70a3d70a3d71,peVar1,&local_98,&local_b8,
             &matr);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_98._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c8._M_refcount);
  ChMatrix33<double>::Set_A_quaternion(&matr,(ChQuaternion<double> *)&Q_ROTATE_Y_TO_Z);
  std::__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_c8,
             (__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2> *)
             ((this->super_Copter<6>).chassis.
              super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 0x198));
  std::__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_88,
             &material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>);
  local_b8._M_ptr = (element_type *)0x0;
  local_b8._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_a8 = 0x3fd1cfaacd9e83e4;
  (**(code **)(*(long *)local_c8._M_ptr + 0x40))
            (0x3ff190ff97247454,0x3ff190ff97247454,0x3fb999999999999a,local_c8._M_ptr,&local_88,
             &local_b8,&matr);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c8._M_refcount);
  std::__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_b8,
             (__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2> *)
             ((this->super_Copter<6>).chassis.
              super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 0x198));
  (**(code **)(*(long *)local_b8._M_ptr + 0x20))();
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b8._M_refcount);
  chrono::ChBody::SetCollide
            (SUB81((this->super_Copter<6>).chassis.
                   super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0));
  return;
}

Assistant:

void Little_Hexy::AddCollisionShapes(std::shared_ptr<ChMaterialSurface> material) {
    chassis->GetCollisionModel()->ClearModel();
    // Legs and body boundary box
    chassis->GetCollisionModel()->AddBox(material, 0.279, 0.279, 0.46);
    // Arms and propellers boundary cylinder
    // propeller arm + propeller radius
    double radius = 0.762 + 0.6718 / 2;
    ChMatrix33<> matr(Q_ROTATE_Y_TO_Z);
    chassis->GetCollisionModel()->AddCylinder(material, radius, radius, 0.1, ChVector<>(0, 0, 0.2783), matr);
    chassis->GetCollisionModel()->BuildModel();
    chassis->SetCollide(true);
}